

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_vtab_rhs_value(sqlite3_index_info *pIdxInfo,int iCons,sqlite3_value **ppVal)

{
  WhereTerm *ppVal_00;
  undefined8 *in_RDX;
  int in_ESI;
  int *in_RDI;
  WhereTerm *pTerm;
  int rc;
  sqlite3_value *pVal;
  HiddenIndexInfo *pH;
  int iVar1;
  Expr *pExpr;
  sqlite3 *db;
  
  db = (sqlite3 *)(in_RDI + 0x18);
  pExpr = (Expr *)0x0;
  iVar1 = 0;
  if ((in_ESI < 0) || (*in_RDI <= in_ESI)) {
    iVar1 = sqlite3MisuseError(0);
  }
  else {
    if (*(long *)(in_RDI + (long)in_ESI * 2 + 0x20) == 0) {
      ppVal_00 = termFromWhereClause((WhereClause *)db->pVfs,
                                     *(int *)(*(long *)(in_RDI + 2) + (long)in_ESI * 0xc + 8));
      iVar1 = sqlite3ValueFromExpr
                        (db,pExpr,(u8)((uint)iVar1 >> 0x18),(u8)((uint)iVar1 >> 0x10),
                         (sqlite3_value **)ppVal_00);
    }
    pExpr = *(Expr **)(db->aLimit + (long)in_ESI * 2 + -0x1a);
  }
  *in_RDX = pExpr;
  if ((iVar1 == 0) && (pExpr == (Expr *)0x0)) {
    iVar1 = 0xc;
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_vtab_rhs_value(
  sqlite3_index_info *pIdxInfo,   /* Copy of first argument to xBestIndex */
  int iCons,                      /* Constraint for which RHS is wanted */
  sqlite3_value **ppVal           /* Write value extracted here */
){
  HiddenIndexInfo *pH = (HiddenIndexInfo*)&pIdxInfo[1];
  sqlite3_value *pVal = 0;
  int rc = SQLITE_OK;
  if( iCons<0 || iCons>=pIdxInfo->nConstraint ){
    rc = SQLITE_MISUSE_BKPT; /* EV: R-30545-25046 */
  }else{
    if( pH->aRhs[iCons]==0 ){
      WhereTerm *pTerm = termFromWhereClause(
          pH->pWC, pIdxInfo->aConstraint[iCons].iTermOffset
      );
      rc = sqlite3ValueFromExpr(
          pH->pParse->db, pTerm->pExpr->pRight, ENC(pH->pParse->db),
          SQLITE_AFF_BLOB, &pH->aRhs[iCons]
      );
      testcase( rc!=SQLITE_OK );
    }
    pVal = pH->aRhs[iCons];
  }
  *ppVal = pVal;

  if( rc==SQLITE_OK && pVal==0 ){  /* IMP: R-19933-32160 */
    rc = SQLITE_NOTFOUND;          /* IMP: R-36424-56542 */
  }

  return rc;
}